

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

bstring bgets(bNgetc getcPtr,void *parm,char terminator)

{
  int iVar1;
  bstring b;
  
  if ((getcPtr != (bNgetc)0x0) && (b = bfromcstr(""), b != (bstring)0x0)) {
    iVar1 = bgetsa(b,getcPtr,parm,terminator);
    if ((-1 < iVar1) && (0 < b->slen)) {
      return b;
    }
    bdestroy(b);
  }
  return (bstring)0x0;
}

Assistant:

bstring bgets (bNgetc getcPtr, void * parm, char terminator) {
int ret;
bstring buff;

	if (NULL == getcPtr || NULL == (buff = bfromcstr (""))) return NULL;

	ret = bgetsa (buff, getcPtr, parm, terminator);
	if (ret < 0 || buff->slen <= 0) {
		bdestroy (buff);
		buff = NULL;
	}
	return buff;
}